

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O0

string * __thiscall adios2::format::BP4Base::GetBPMetadataFileName(BP4Base *this,string *name)

{
  string *in_RDI;
  size_t index;
  string bpName;
  string *bpMetaDataRankName;
  string *__lhs;
  char __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_68 [39];
  undefined1 local_41;
  undefined8 local_40;
  string local_38 [56];
  
  __rhs = (char)((ulong)local_38 >> 0x38);
  __lhs = in_RDI;
  helper::RemoveTrailingSlash(in_RDI);
  local_40 = 0;
  local_41 = 0;
  std::operator+(in_stack_ffffffffffffff58,__rhs);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff78);
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  local_41 = 1;
  std::__cxx11::string::~string(local_38);
  return __lhs;
}

Assistant:

std::string BP4Base::GetBPMetadataFileName(const std::string &name) const noexcept
{
    const std::string bpName = helper::RemoveTrailingSlash(name);
    const size_t index = 0; // global metadata file is generated by rank 0
    /* the name of the metadata file is "md.0" */
    const std::string bpMetaDataRankName(bpName + PathSeparator + "md." + std::to_string(index));
    return bpMetaDataRankName;
}